

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathNodeSetAddNs(xmlNodeSetPtr cur,xmlNodePtr node,xmlNsPtr ns)

{
  int iVar1;
  xmlNodePtr pxVar2;
  xmlNodePtr nsNode;
  int i;
  xmlNsPtr ns_local;
  xmlNodePtr node_local;
  xmlNodeSetPtr cur_local;
  
  if ((((cur == (xmlNodeSetPtr)0x0) || (ns == (xmlNsPtr)0x0)) || (node == (xmlNodePtr)0x0)) ||
     ((ns->type != XML_NAMESPACE_DECL || (node->type != XML_ELEMENT_NODE)))) {
    cur_local._4_4_ = -1;
  }
  else {
    for (nsNode._4_4_ = 0; nsNode._4_4_ < cur->nodeNr; nsNode._4_4_ = nsNode._4_4_ + 1) {
      if (((cur->nodeTab[nsNode._4_4_] != (xmlNodePtr)0x0) &&
          (cur->nodeTab[nsNode._4_4_]->type == XML_NAMESPACE_DECL)) &&
         (((xmlNodePtr)cur->nodeTab[nsNode._4_4_]->_private == node &&
          (iVar1 = xmlStrEqual(ns->prefix,(xmlChar *)cur->nodeTab[nsNode._4_4_]->children),
          iVar1 != 0)))) {
        return 0;
      }
    }
    if ((cur->nodeNr < cur->nodeMax) || (iVar1 = xmlXPathNodeSetGrow(cur), -1 < iVar1)) {
      pxVar2 = xmlXPathNodeSetDupNs(node,ns);
      if (pxVar2 == (xmlNodePtr)0x0) {
        cur_local._4_4_ = -1;
      }
      else {
        iVar1 = cur->nodeNr;
        cur->nodeNr = iVar1 + 1;
        cur->nodeTab[iVar1] = pxVar2;
        cur_local._4_4_ = 0;
      }
    }
    else {
      cur_local._4_4_ = -1;
    }
  }
  return cur_local._4_4_;
}

Assistant:

int
xmlXPathNodeSetAddNs(xmlNodeSetPtr cur, xmlNodePtr node, xmlNsPtr ns) {
    int i;
    xmlNodePtr nsNode;

    if ((cur == NULL) || (ns == NULL) || (node == NULL) ||
        (ns->type != XML_NAMESPACE_DECL) ||
	(node->type != XML_ELEMENT_NODE))
	return(-1);

    /* @@ with_ns to check whether namespace nodes should be looked at @@ */
    /*
     * prevent duplicates
     */
    for (i = 0;i < cur->nodeNr;i++) {
        if ((cur->nodeTab[i] != NULL) &&
	    (cur->nodeTab[i]->type == XML_NAMESPACE_DECL) &&
	    (((xmlNsPtr)cur->nodeTab[i])->next == (xmlNsPtr) node) &&
	    (xmlStrEqual(ns->prefix, ((xmlNsPtr)cur->nodeTab[i])->prefix)))
	    return(0);
    }

    /*
     * grow the nodeTab if needed
     */
    if (cur->nodeNr >= cur->nodeMax) {
        if (xmlXPathNodeSetGrow(cur) < 0)
            return(-1);
    }
    nsNode = xmlXPathNodeSetDupNs(node, ns);
    if(nsNode == NULL)
        return(-1);
    cur->nodeTab[cur->nodeNr++] = nsNode;
    return(0);
}